

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

Field<Fixpp::TagT<625U,_Fixpp::Type::String>_> * __thiscall
Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>::operator=
          (Field<Fixpp::TagT<625U,_Fixpp::Type::String>_> *this,
          Field<Fixpp::TagT<625U,_Fixpp::Type::String>_> *other)

{
  bool bVar1;
  Field<Fixpp::TagT<625U,_Fixpp::Type::String>_> *other_local;
  Field<Fixpp::TagT<625U,_Fixpp::Type::String>_> *this_local;
  
  bVar1 = empty(other);
  if (bVar1) {
    this->empty_ = true;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->val_,&other->val_);
    this->empty_ = false;
    other->empty_ = true;
  }
  return this;
}

Assistant:

Field& operator=(Field&& other)
        {
            if (!other.empty())
            {
                val_ = std::move(other.val_);
                empty_ = false;
                other.empty_ = true;
            }
            else
            {
                empty_ = true;
            }
            return *this;
        }